

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

IndexPair __thiscall
slang::IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u>::
modifyRoot<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,true>,slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,false>,true>
          (IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u> *this,
          LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true> *rootNode,
          uint32_t position,allocator_type *alloc)

{
  interval<unsigned_long> *piVar1;
  unsigned_long *puVar2;
  uint uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u> *pIVar6;
  bool bVar7;
  LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false> *pLVar8;
  ulong *puVar9;
  bool bVar10;
  uint uVar11;
  undefined8 *puVar12;
  long lVar13;
  uint *puVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint *puVar18;
  int iVar19;
  uint32_t sizes [2];
  uint32_t local_58;
  uint local_54;
  ulong local_50 [2];
  IndexPair local_40;
  IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u> *local_38;
  
  puVar18 = &local_58;
  puVar14 = &local_58;
  local_38 = this;
  local_40 = IntervalMapDetails::distribute(2,*(uint32_t *)(this + 0xc4),8,&local_58,position);
  uVar16 = 0;
  puVar9 = local_50 + 1;
  local_50[1] = 0;
  local_50[0] = 0;
  bVar7 = true;
  do {
    bVar10 = bVar7;
    pLVar8 = PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)alloc);
    pIVar6 = local_38;
    uVar3 = *puVar18;
    iVar19 = (int)uVar16;
    if (uVar3 != 0) {
      lVar13 = 0;
      uVar11 = uVar3;
      do {
        piVar1 = (rootNode->
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                 ).first + uVar16;
        uVar5 = piVar1->right;
        puVar2 = (unsigned_long *)
                 ((long)&(pLVar8->
                         super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                         ).first[0].left + lVar13 * 2);
        *puVar2 = piVar1->left;
        puVar2[1] = uVar5;
        *(ValueDriver **)
         ((long)(pLVar8->
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
                ).second + lVar13) =
             (rootNode->
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
             ).second[uVar16];
        uVar16 = (ulong)((int)uVar16 + 1);
        lVar13 = lVar13 + 8;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
    uVar16 = (ulong)(iVar19 + uVar3);
    *puVar9 = (ulong)pLVar8 & 0xffffffffffffffc0 | (ulong)(uVar3 - 1);
    puVar9 = local_50;
    puVar18 = &local_54;
    bVar7 = false;
  } while (bVar10);
  lVar13 = 0;
  memset(local_38,0,0xc0);
  puVar9 = local_50 + 1;
  bVar7 = true;
  do {
    bVar10 = bVar7;
    uVar16 = *puVar9;
    puVar12 = (undefined8 *)(uVar16 & 0xffffffffffffffc0);
    uVar15 = puVar12[1];
    if (1 < (ulong)*puVar14) {
      lVar17 = 0;
      do {
        uVar4 = *(ulong *)((long)puVar12 + lVar17 + 0x18);
        if (uVar15 <= uVar4) {
          uVar15 = uVar4;
        }
        lVar17 = lVar17 + 0x10;
      } while ((ulong)*puVar14 * 0x10 + -0x10 != lVar17);
    }
    *(undefined8 *)(pIVar6 + lVar13 * 0x10 + 0x40) = *puVar12;
    *(ulong *)(pIVar6 + lVar13 * 0x10 + 0x48) = uVar15;
    *(ulong *)(pIVar6 + lVar13 * 8) = uVar16;
    lVar13 = 1;
    puVar14 = &local_54;
    puVar9 = local_50;
    bVar7 = false;
  } while (bVar10);
  *(undefined4 *)(pIVar6 + 0xc4) = 2;
  *(int *)(pIVar6 + 0xc0) = *(int *)(pIVar6 + 0xc0) + 1;
  return local_40;
}

Assistant:

IntervalMapDetails::IndexPair IntervalMap<TKey, TValue, N>::modifyRoot(TRootNode& rootNode,
                                                                       uint32_t position,
                                                                       allocator_type& alloc) {
    using namespace IntervalMapDetails;

    // Split the root branch node into two new nodes.
    constexpr uint32_t NumNodes = 2;
    uint32_t sizes[NumNodes];
    IndexPair newOffset = distribute(NumNodes, rootSize, Leaf::Capacity, sizes, position);

    // Construct new nodes.
    uint32_t pos = 0;
    NodeRef nodes[NumNodes];
    for (uint32_t i = 0; i < NumNodes; i++) {
        auto newNode = alloc.template emplace<TNewNode>();
        uint32_t size = sizes[i];

        newNode->copy(rootNode, pos, 0, size);
        nodes[i] = NodeRef(newNode, size);
        pos += size;
    }

    if (SwitchToBranch) {
        // Destroy the old root leaf and switch it to a branch node.
        rootLeaf.~RootLeaf();
        new (&rootBranch) RootBranch();
    }

    for (uint32_t i = 0; i < NumNodes; i++) {
        rootBranch.keyAt(i) = nodes[i].template get<TNewNode>().getBounds(sizes[i]);
        rootBranch.childAt(i) = nodes[i];
    }

    rootSize = NumNodes;
    height++;
    return newOffset;
}